

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  int iVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  size_type sVar5;
  size_type sVar6;
  int iVar7;
  SimInfo *info;
  DumpWriter *this;
  Molecule *pMVar8;
  pointer ppSVar9;
  char *pcVar10;
  long lVar11;
  int whichFrame;
  string outputFileName;
  string inputFileName;
  SimCreator creator;
  Thermo thermo;
  MoleculeIterator i;
  gengetopt_args_info args_info;
  DumpReader reader;
  string local_13c0;
  string local_13a0;
  SimCreator local_1380;
  Thermo local_1358;
  MoleculeIterator local_1350;
  double local_1348 [4];
  double local_1328 [4];
  double local_1308 [4];
  Vector3d local_12e8;
  gengetopt_args_info local_12d0;
  DumpReader local_1288;
  
  OpenMD::registerLattice();
  local_13a0._M_dataplus._M_p = (pointer)&local_13a0.field_2;
  local_13a0._M_string_length = 0;
  local_13a0.field_2._M_local_buf[0] = '\0';
  local_13c0._M_dataplus._M_p = (pointer)&local_13c0.field_2;
  local_13c0._M_string_length = 0;
  local_13c0.field_2._M_local_buf[0] = '\0';
  iVar7 = cmdline_parser(argc,argv,&local_12d0);
  sVar5 = local_13a0._M_string_length;
  if (iVar7 != 0) {
    exit(1);
  }
  if (local_12d0.inputs_num == 0) {
    builtin_strncpy(painCave.errMsg,"No input file name was specified on the command line",0x35);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    pcVar10 = *local_12d0.inputs;
    strlen(pcVar10);
    std::__cxx11::string::_M_replace((ulong)&local_13a0,0,(char *)sVar5,(ulong)pcVar10);
  }
  local_1380.mdFileName_._M_dataplus._M_p = (pointer)&local_1380.mdFileName_.field_2;
  local_1380._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002f6198;
  local_1380.mdFileName_._M_string_length = 0;
  local_1380.mdFileName_.field_2._M_local_buf[0] = '\0';
  info = OpenMD::SimCreator::createSim(&local_1380,&local_13a0,false);
  OpenMD::DumpReader::DumpReader(&local_1288,info,&local_13a0);
  sVar5 = local_13c0._M_string_length;
  strlen(local_12d0.output_arg);
  std::__cxx11::string::_M_replace((ulong)&local_13c0,0,(char *)sVar5,(ulong)local_12d0.output_arg);
  sVar6 = local_13a0._M_string_length;
  sVar5 = local_13c0._M_string_length;
  pcVar10 = (char *)local_13c0._M_string_length;
  if (local_13a0._M_string_length < local_13c0._M_string_length) {
    pcVar10 = (char *)local_13a0._M_string_length;
  }
  if (pcVar10 == (char *)0x0) {
    if (local_13c0._M_string_length != local_13a0._M_string_length) goto LAB_00127c10;
  }
  else {
    iVar7 = bcmp(local_13c0._M_dataplus._M_p,local_13a0._M_dataplus._M_p,(size_t)pcVar10);
    if ((sVar5 != sVar6) || (iVar7 != 0)) goto LAB_00127c10;
  }
  builtin_strncpy(painCave.errMsg,"Input and Output File names should be different!",0x31);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
LAB_00127c10:
  this = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this,info,&local_13c0);
  iVar7 = OpenMD::DumpReader::getNFrames(&local_1288);
  local_1350._M_node = (_Base_ptr)0x0;
  local_1358.info_ = info;
  if (0 < iVar7) {
    whichFrame = 0;
    do {
      OpenMD::DumpReader::readFrame(&local_1288,whichFrame);
      OpenMD::Thermo::getCom(&local_12e8,&local_1358);
      local_1308[2] = local_12e8.super_Vector<double,_3U>.data_[2];
      local_1308[0] = local_12e8.super_Vector<double,_3U>.data_[0];
      local_1308[1] = local_12e8.super_Vector<double,_3U>.data_[1];
      pMVar8 = OpenMD::SimInfo::beginMolecule(info,&local_1350);
      while (pMVar8 != (Molecule *)0x0) {
        ppSVar3 = (pMVar8->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppSVar9 = (pMVar8->integrableObjects_).
                       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (ppSVar9 != ppSVar3 && (pSVar4 = *ppSVar9, pSVar4 != (StuntDouble *)0x0));
            ppSVar9 = ppSVar9 + 1) {
          lVar11 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
          local_1328[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
          pdVar1 = (double *)(lVar11 + (long)pSVar4->localIndex_ * 0x18);
          local_1328[0] = *pdVar1;
          local_1328[1] = pdVar1[1];
          local_1348[0] = 0.0;
          local_1348[1] = 0.0;
          local_1348[2] = 0.0;
          lVar11 = 0;
          do {
            local_1348[lVar11] = local_1328[lVar11] - local_1308[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          iVar2 = pSVar4->localIndex_;
          lVar11 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
          *(double *)(lVar11 + 0x10 + (long)iVar2 * 0x18) = local_1348[2];
          pdVar1 = (double *)(lVar11 + (long)iVar2 * 0x18);
          *pdVar1 = local_1348[0];
          pdVar1[1] = local_1348[1];
        }
        pMVar8 = OpenMD::SimInfo::nextMolecule(info,&local_1350);
      }
      OpenMD::DumpWriter::writeDump(this);
      whichFrame = whichFrame + 1;
    } while (whichFrame != iVar7);
  }
  OpenMD::DumpWriter::~DumpWriter(this);
  operator_delete(this,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           local_13c0._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  OpenMD::DumpReader::~DumpReader(&local_1288);
  local_1380._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002f6198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1380.mdFileName_._M_dataplus._M_p != &local_1380.mdFileName_.field_2) {
    operator_delete(local_1380.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_1380.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_1380.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c0._M_dataplus._M_p != &local_13c0.field_2) {
    operator_delete(local_13c0._M_dataplus._M_p,
                    CONCAT71(local_13c0.field_2._M_allocated_capacity._1_7_,
                             local_13c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13a0._M_dataplus._M_p != &local_13a0.field_2) {
    operator_delete(local_13a0._M_dataplus._M_p,
                    CONCAT71(local_13a0.field_2._M_allocated_capacity._1_7_,
                             local_13a0.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;

  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input file name was specified "
             "on the command line");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, false);
  DumpReader reader(info, inputFileName);

  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  DumpWriter* writer = new DumpWriter(info, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  int nFrames = reader.getNFrames();
  Vector3d COM;
  Vector3d pos;
  SimInfo::MoleculeIterator i;
  Molecule::IntegrableObjectIterator j;
  Molecule* mol;
  StuntDouble* sd;
  Thermo thermo(info);

  for (int istep = 0; istep < nFrames; istep++) {
    reader.readFrame(istep);
    COM = thermo.getCom();
    for (mol = info->beginMolecule(i); mol != NULL;
         mol = info->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos = sd->getPos();
        sd->setPos(pos - COM);
      }
    }
    writer->writeDump();
  }

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.severity = OPENMD_INFO;
  painCave.isFatal  = 0;
  simError();

  return 0;
}